

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::mouseMoveEvent(QAbstractItemView *this,QMouseEvent *event)

{
  QAbstractItemViewPrivate *this_00;
  QWidget *pQVar1;
  QAbstractItemModel *pQVar2;
  Data *pDVar3;
  int iVar4;
  SelectionFlag SVar5;
  bool bVar6;
  char cVar7;
  undefined4 uVar8;
  uint uVar9;
  LayoutDirection LVar10;
  int iVar11;
  SelectionFlag SVar12;
  ulong uVar13;
  ulong uVar14;
  QObject *pQVar15;
  QPoint QVar16;
  QPoint QVar17;
  long in_FS_OFFSET;
  bool bVar18;
  double extraout_XMM0_Qa;
  undefined1 auVar19 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar20 [16];
  QPersistentModelIndex index;
  QPoint bottomRight;
  QModelIndex local_c0;
  QPoint local_a8;
  QPoint QStack_a0;
  QModelIndex local_98;
  QArrayData *local_80 [2];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_70;
  QModelIndex local_68;
  QPersistentModelIndex local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  uVar8 = QEventPoint::position();
  auVar20._0_8_ =
       (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM1_Qa;
  auVar20._8_8_ =
       (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM0_Qa;
  auVar20 = minpd(_DAT_0066f5d0,auVar20);
  auVar19._8_8_ = -(ulong)(-2147483648.0 < auVar20._8_8_);
  auVar19._0_8_ = -(ulong)(-2147483648.0 < auVar20._0_8_);
  uVar9 = movmskpd(uVar8,auVar19);
  uVar14 = 0x8000000000000000;
  if ((uVar9 & 1) != 0) {
    uVar14 = (ulong)(uint)(int)auVar20._0_8_ << 0x20;
  }
  uVar13 = 0x80000000;
  if ((uVar9 & 2) != 0) {
    uVar13 = (ulong)(uint)(int)auVar20._8_8_;
  }
  local_40 = (QPoint)(uVar13 | uVar14);
  pQVar1 = *(QWidget **)
            &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  LVar10 = QWidget::layoutDirection(pQVar1);
  iVar11 = (**(code **)(*(long *)pQVar1 + 0x2b0))(pQVar1);
  iVar4 = -iVar11;
  if (LVar10 != RightToLeft) {
    iVar4 = iVar11;
  }
  iVar11 = (**(code **)(*(long *)pQVar1 + 0x2b8))(pQVar1);
  QVar16.xp.m_i = iVar4 + local_40.xp.m_i;
  QVar16.yp.m_i = iVar11 + local_40.yp.m_i;
  this_00->draggedPosition = QVar16;
  if (1 < *(int *)(*(long *)(this + 8) + 0x3a8) - 4U) {
    if (*(int *)(*(long *)(this + 8) + 0x3a8) == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QAbstractItemViewPrivate::maybeStartDrag(this_00,local_40);
        return;
      }
      goto LAB_0053d918;
    }
    local_48.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)this + 0x1f0))(&local_68,this,&local_40);
    QPersistentModelIndex::QPersistentModelIndex(&local_48,&local_68);
    local_68.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = this_00->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)local_80,&this_00->pressedIndex);
    (**(code **)(*(long *)pQVar2 + 0x148))(&local_68,pQVar2,(QModelIndex *)local_80);
    if ((*(int *)(*(long *)(this + 8) + 0x3a8) != 3) ||
       (bVar6 = QAbstractItemViewPrivate::hasEditor(this_00,&local_68), !bVar6)) {
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_80,&local_48);
      cVar7 = (**(code **)(*(long *)this + 0x2e0))(this,(QModelIndex *)local_80,0,event);
      if (cVar7 == '\0') {
        QVar17 = local_40;
        if (this_00->selectionMode != SingleSelection) {
          pQVar1 = *(QWidget **)
                    &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                     super_QWidgetPrivate.field_0x8;
          LVar10 = QWidget::layoutDirection(pQVar1);
          iVar11 = (**(code **)(*(long *)pQVar1 + 0x2b0))(pQVar1);
          iVar4 = -iVar11;
          if (LVar10 == RightToLeft) {
            iVar4 = iVar11;
          }
          iVar11 = (**(code **)(*(long *)pQVar1 + 0x2b8))(pQVar1);
          QVar17.xp.m_i = iVar4 + (this_00->pressedPosition).xp.m_i;
          QVar17.yp.m_i = (this_00->pressedPosition).yp.m_i - iVar11;
        }
        QAbstractItemViewPrivate::checkMouseMove(this_00,&local_48);
        cVar7 = QPersistentModelIndex::isValid();
        if ((((cVar7 == '\0') || (this_00->dragEnabled != true)) ||
            (*(int *)(*(long *)(this + 8) + 0x3a8) == 2)) || (*(int *)(event + 0x44) == 0)) {
          bVar6 = false;
          bVar18 = false;
        }
        else {
          QAbstractItemViewPrivate::selectedDraggableIndexes((QModelIndexList *)local_80,this_00);
          bVar18 = local_70.ptr != (QAbstractItemModel *)0x0;
          bVar6 = true;
        }
        if ((bVar6) && (local_80[0] != (QArrayData *)0x0)) {
          LOCK();
          (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_80[0],0x18,0x10);
          }
        }
        if (bVar18) {
          *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 1;
          QAbstractItemViewPrivate::maybeStartDrag(this_00,local_40);
        }
        else if (((byte)event[0x44] & 1) != 0) {
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_98,&local_48);
          cVar7 = (**(code **)(*(long *)&(this_00->super_QAbstractScrollAreaPrivate).
                                         super_QFramePrivate.super_QWidgetPrivate + 0x138))
                            (this_00,&local_98);
          if (((cVar7 != '\0') && (pDVar3 = (this_00->selectionModel).wp.d, pDVar3 != (Data *)0x0))
             && ((*(int *)(pDVar3 + 4) != 0 &&
                 ((this_00->selectionModel).wp.value != (QObject *)0x0)))) {
            *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 2;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_98,&local_48);
            SVar12 = (**(code **)(*(long *)this + 0x2e8))(this,&local_98,event);
            SVar5 = SVar12 & ~Toggle | this_00->ctrlDragSelectionFlag;
            if ((SVar12 & Toggle) == NoUpdate) {
              SVar5 = SVar12;
            }
            if (this_00->ctrlDragSelectionFlag == NoUpdate) {
              SVar5 = SVar12;
            }
            QStack_a0 = local_40;
            local_a8 = QVar17;
            (**(code **)(*(long *)this + 0x2c8))(this,&local_a8,SVar5);
            cVar7 = QPersistentModelIndex::isValid();
            if (cVar7 != '\0') {
              QItemSelectionModel::currentIndex();
              cVar7 = comparesEqual(&local_48,&local_98);
              if (cVar7 == '\0') {
                QPersistentModelIndex::operator_cast_to_QModelIndex(&local_c0,&local_48);
                uVar14 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_c0);
                if ((uVar14 & 0x20) != 0) {
                  pDVar3 = (this_00->selectionModel).wp.d;
                  if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
                    pQVar15 = (QObject *)0x0;
                  }
                  else {
                    pQVar15 = (this_00->selectionModel).wp.value;
                  }
                  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_98,&local_48);
                  (**(code **)(*(long *)pQVar15 + 0x60))(pQVar15,&local_98,0);
                  goto LAB_0053d8e6;
                }
              }
            }
            local_98._0_8_ = QMouseEvent::pos(event);
            bVar6 = QAbstractItemViewPrivate::shouldAutoScroll(this_00,(QPoint *)&local_98);
            if ((bVar6) && ((this_00->autoScrollTimer).m_id == Invalid)) {
              startAutoScroll(this);
            }
          }
        }
      }
    }
LAB_0053d8e6:
    QPersistentModelIndex::~QPersistentModelIndex(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0053d918:
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);
    QPoint bottomRight = event->position().toPoint();

    d->draggedPosition = bottomRight + d->offset();

    if (state() == ExpandingState || state() == CollapsingState)
        return;

#if QT_CONFIG(draganddrop)
    if (state() == DraggingState) {
        d->maybeStartDrag(bottomRight);
        return;
    }
#endif // QT_CONFIG(draganddrop)

    QPersistentModelIndex index = indexAt(bottomRight);
    QModelIndex buddy = d->model->buddy(d->pressedIndex);
    if ((state() == EditingState && d->hasEditor(buddy))
        || edit(index, NoEditTriggers, event))
        return;

    const QPoint topLeft =
            d->selectionMode != SingleSelection ? d->pressedPosition - d->offset() : bottomRight;

    d->checkMouseMove(index);

#if QT_CONFIG(draganddrop)
    if (d->pressedIndex.isValid()
        && d->dragEnabled
        && (state() != DragSelectingState)
        && (event->buttons() != Qt::NoButton)
        && !d->selectedDraggableIndexes().isEmpty()) {
            setState(DraggingState);
            d->maybeStartDrag(bottomRight);
            return;
    }
#endif

    if ((event->buttons() & Qt::LeftButton) && d->selectionAllowed(index) && d->selectionModel) {
        setState(DragSelectingState);
        QItemSelectionModel::SelectionFlags command = selectionCommand(index, event);
        if (d->ctrlDragSelectionFlag != QItemSelectionModel::NoUpdate && command.testFlag(QItemSelectionModel::Toggle)) {
            command &= ~QItemSelectionModel::Toggle;
            command |= d->ctrlDragSelectionFlag;
        }

        // Do the normalize ourselves, since QRect::normalized() is flawed
        QRect selectionRect = QRect(topLeft, bottomRight);
        setSelection(selectionRect, command);

        // set at the end because it might scroll the view
        if (index.isValid() && (index != d->selectionModel->currentIndex()) && d->isIndexEnabled(index))
            d->selectionModel->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
        else if (d->shouldAutoScroll(event->pos()) && !d->autoScrollTimer.isActive())
            startAutoScroll();
    }
}